

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

ostream * pstd::operator<<(ostream *os,optional<const_pbrt::RGBColorSpace_*> *opt)

{
  bool bVar1;
  RGBColorSpace **ppRVar2;
  ostream *poVar3;
  char *pcVar4;
  optional<const_pbrt::RGBColorSpace_*> *in_RSI;
  ostream *in_RDI;
  optional<const_pbrt::RGBColorSpace_*> *in_stack_ffffffffffffffd0;
  ostream *local_8;
  
  bVar1 = optional<const_pbrt::RGBColorSpace_*>::has_value(in_RSI);
  if (bVar1) {
    poVar3 = std::operator<<(in_RDI,"[ pstd::optional<");
    pcVar4 = std::type_info::name((type_info *)&pbrt::RGBColorSpace_const*::typeinfo);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"> set: true ");
    poVar3 = std::operator<<(poVar3,"value: ");
    ppRVar2 = optional<const_pbrt::RGBColorSpace_*>::value(in_stack_ffffffffffffffd0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*ppRVar2);
    local_8 = std::operator<<(poVar3," ]");
  }
  else {
    poVar3 = std::operator<<(in_RDI,"[ pstd::optional<");
    pcVar4 = std::type_info::name((type_info *)&pbrt::RGBColorSpace_const*::typeinfo);
    poVar3 = std::operator<<(poVar3,pcVar4);
    local_8 = std::operator<<(poVar3,"> set: false value: n/a ]");
  }
  return local_8;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}